

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::PromiseResolver
          (PromiseResolver<QList<QByteArray>_> *this,QPromise<QList<QByteArray>_> *promise)

{
  Data *pDVar1;
  QPromise<QList<QByteArray>_> *this_00;
  QPromise<QList<QByteArray>_> *promise_local;
  PromiseResolver<QList<QByteArray>_> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<QList<QByteArray>_> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>::
  QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<QList<QByteArray>_> *)operator_new(0x10);
  QtPromise::QPromise<QList<QByteArray>_>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
           ::operator->(&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }